

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_restr(lysp_yang_ctx *ctx,ly_stmt restr_kw,lysp_restr *restr)

{
  lysp_ext_instance **exts;
  size_t len;
  LY_ERR LVar1;
  char *pcVar2;
  char *pcVar3;
  char **ppcVar4;
  ly_stmt parent_stmt;
  lysp_restr *plVar5;
  ly_ctx *plVar6;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff90;
  ly_stmt in_stack_ffffffffffffff94;
  char *local_68;
  size_t local_60;
  char **local_58;
  char **local_50;
  char **local_48;
  char **local_40;
  char *local_38;
  
  LVar1 = get_argument(ctx,Y_STR_ARG,&(restr->arg).flags,&local_68,&local_38,&local_60);
  len = local_60;
  if (LVar1 == LY_SUCCESS) {
    if (local_60 == 0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar2 = lyplg_ext_stmt2str(restr_kw);
      ly_log(plVar6,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",pcVar2
            );
    }
    if (local_38 == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar2 = local_68;
      if (len == 0) {
        pcVar2 = "";
      }
      LVar1 = lydict_insert(plVar6,pcVar2,len,(char **)restr);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar1 = lydict_insert_zc(plVar6,local_68,(char **)restr);
    }
    if (LVar1 == LY_SUCCESS) {
      (restr->arg).mod =
           (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      LVar1 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = LY_SUCCESS, in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_SEMICOLON)) {
        if (in_stack_ffffffffffffff94 == LY_STMT_SYNTAX_LEFT_BRACE) {
          LVar1 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
          if ((LVar1 == LY_SUCCESS) &&
             (LVar1 = LY_SUCCESS, in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
            exts = &restr->exts;
            local_40 = &restr->emsg;
            local_48 = &restr->eapptag;
            local_50 = &restr->ref;
            local_58 = &restr->dsc;
            do {
              plVar5 = restr;
              if ((int)in_stack_ffffffffffffff94 < 0xd0000) {
                if (in_stack_ffffffffffffff94 == LY_STMT_DESCRIPTION) {
                  plVar5 = (lysp_restr *)*local_58;
                  parent_stmt = LY_STMT_DESCRIPTION;
                  ppcVar4 = local_58;
                }
                else {
                  if (in_stack_ffffffffffffff94 != LY_STMT_ERROR_APP_TAG) {
LAB_0017e6ab:
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar6 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar6 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar2 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
                    pcVar3 = lyplg_ext_stmt2str(restr_kw);
                    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                            "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,pcVar3);
                    goto LAB_0017e6a0;
                  }
                  parent_stmt = LY_STMT_ERROR_APP_TAG;
                  ppcVar4 = local_48;
                }
LAB_0017e5f9:
                LVar1 = parse_text_field(ctx,plVar5,parent_stmt,(uint32_t)ppcVar4,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,
                                         (lysp_ext_instance **)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90));
              }
              else {
                if (in_stack_ffffffffffffff94 == LY_STMT_ERROR_MESSAGE) {
                  parent_stmt = LY_STMT_ERROR_MESSAGE;
                  ppcVar4 = local_40;
                  goto LAB_0017e5f9;
                }
                if (in_stack_ffffffffffffff94 != LY_STMT_EXTENSION_INSTANCE) {
                  if (in_stack_ffffffffffffff94 != LY_STMT_REFERENCE) goto LAB_0017e6ab;
                  parent_stmt = LY_STMT_REFERENCE;
                  ppcVar4 = local_50;
                  plVar5 = (lysp_restr *)*local_50;
                  goto LAB_0017e5f9;
                }
                LVar1 = parse_ext(ctx,local_68,local_60,restr,restr_kw,0,exts);
              }
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
              LVar1 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
            } while (in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_RIGHT_BRACE);
            if ((*exts == (lysp_ext_instance *)0x0) ||
               (LVar1 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
               LVar1 == LY_SUCCESS)) {
              LVar1 = LY_SUCCESS;
            }
          }
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar2 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
          ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
LAB_0017e6a0:
          LVar1 = LY_EVALID;
        }
      }
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
parse_restr(struct lysp_yang_ctx *ctx, enum ly_stmt restr_kw, struct lysp_restr *restr)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, &restr->arg.flags, &word, &buf, &word_len));

    CHECK_NONEMPTY(ctx, word_len, lyplg_ext_stmt2str(restr_kw));
    INSERT_WORD_GOTO(ctx, buf, restr->arg.str, word, word_len, ret, cleanup);
    restr->arg.mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, restr->dsc, LY_STMT_DESCRIPTION, 0, &restr->dsc, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, restr->ref, LY_STMT_REFERENCE, 0, &restr->ref, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_APP_TAG, 0, &restr->eapptag, Y_STR_ARG, NULL,
                    &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_MESSAGE, 0, &restr->emsg, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, restr, restr_kw, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(restr_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, restr->exts, ret, cleanup);
    }

cleanup:
    return ret;
}